

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O0

void do_accept(uv_timer_t *timer_handle)

{
  uv_stream_t *server_00;
  int iVar1;
  uv_tcp_t *tcp;
  uv_loop_t *loop;
  int r;
  uv_tcp_t *accepted_handle;
  uv_tcp_t *server;
  uv_timer_t *timer_handle_local;
  
  tcp = (uv_tcp_t *)malloc(0xf8);
  if (timer_handle == (uv_timer_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-delayed-accept.c"
            ,0x35,"timer_handle != NULL");
    abort();
  }
  if (tcp == (uv_tcp_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-delayed-accept.c"
            ,0x36,"accepted_handle != NULL");
    abort();
  }
  loop = uv_default_loop();
  iVar1 = uv_tcp_init(loop,tcp);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-delayed-accept.c"
            ,0x39,"r == 0");
    abort();
  }
  server_00 = (uv_stream_t *)timer_handle->data;
  iVar1 = uv_accept(server_00,(uv_stream_t *)tcp);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-delayed-accept.c"
            ,0x3d,"r == 0");
    abort();
  }
  do_accept_called = do_accept_called + 1;
  uv_close((uv_handle_t *)tcp,close_cb);
  if (do_accept_called == 2) {
    uv_close((uv_handle_t *)server_00,close_cb);
  }
  uv_close((uv_handle_t *)timer_handle,close_cb);
  return;
}

Assistant:

static void do_accept(uv_timer_t* timer_handle) {
  uv_tcp_t* server;
  uv_tcp_t* accepted_handle = (uv_tcp_t*)malloc(sizeof *accepted_handle);
  int r;

  ASSERT(timer_handle != NULL);
  ASSERT(accepted_handle != NULL);

  r = uv_tcp_init(uv_default_loop(), accepted_handle);
  ASSERT(r == 0);

  server = (uv_tcp_t*)timer_handle->data;
  r = uv_accept((uv_stream_t*)server, (uv_stream_t*)accepted_handle);
  ASSERT(r == 0);

  do_accept_called++;

  /* Immediately close the accepted handle. */
  uv_close((uv_handle_t*)accepted_handle, close_cb);

  /* After accepting the two clients close the server handle */
  if (do_accept_called == 2) {
    uv_close((uv_handle_t*)server, close_cb);
  }

  /* Dispose the timer. */
  uv_close((uv_handle_t*)timer_handle, close_cb);
}